

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O2

void searchCurrencyName(CurrencyNameStruct *currencyNames,int32_t total_currency_count,UChar *text,
                       int32_t textLen,int32_t *partialMatchLen,int32_t *maxMatchLen,
                       int32_t *maxMatchIndex)

{
  ulong uVar1;
  UChar UVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  
  *maxMatchIndex = -1;
  *maxMatchLen = 0;
  iVar11 = total_currency_count + -1;
  uVar12 = 0;
  if (0 < textLen) {
    uVar12 = (ulong)(uint)textLen;
  }
  iVar7 = 0;
  uVar8 = 0;
  while( true ) {
    if (uVar8 == uVar12) {
      return;
    }
    UVar2 = text[uVar8];
    iVar5 = iVar11;
    iVar4 = iVar7;
    while( true ) {
      while( true ) {
        if (iVar5 < iVar4) {
          return;
        }
        iVar3 = (iVar5 + iVar4) / 2;
        if (((long)uVar8 < (long)currencyNames[iVar3].currencyNameLen) &&
           ((ushort)UVar2 <= (ushort)currencyNames[iVar3].currencyName[uVar8])) break;
        iVar4 = iVar3 + 1;
      }
      iVar5 = iVar7;
      iVar9 = iVar3;
      if ((ushort)currencyNames[iVar3].currencyName[uVar8] <= (ushort)UVar2) break;
      iVar5 = iVar3 + -1;
    }
    while (iVar7 = iVar5, iVar7 < iVar9) {
      iVar4 = (iVar7 + iVar9) / 2;
      if ((long)uVar8 < (long)currencyNames[iVar4].currencyNameLen) {
        iVar5 = iVar4 + 1;
        if ((ushort)UVar2 <= (ushort)currencyNames[iVar4].currencyName[uVar8]) {
          iVar5 = iVar7;
          iVar9 = iVar4;
        }
      }
      else {
        iVar5 = iVar4 + 1;
      }
    }
    while (iVar5 = iVar3, iVar5 < iVar11) {
      iVar4 = (iVar11 + iVar5) / 2;
      if ((long)currencyNames[iVar4].currencyNameLen < (long)uVar8) {
        iVar3 = iVar4 + 1;
      }
      else {
        iVar3 = iVar4 + 1;
        if ((ushort)UVar2 < (ushort)currencyNames[iVar4].currencyName[uVar8]) {
          iVar11 = iVar4;
          iVar3 = iVar5;
        }
      }
    }
    iVar11 = iVar11 - (uint)((ushort)UVar2 < (ushort)currencyNames[iVar11].currencyName[uVar8]);
    lVar10 = (long)iVar7;
    uVar1 = uVar8 + 1;
    iVar5 = -1;
    if (uVar1 == (uint)currencyNames[lVar10].currencyNameLen) {
      iVar5 = iVar7;
    }
    if (iVar7 == -1) break;
    iVar4 = (int)uVar1;
    if ((long)uVar8 < (long)*partialMatchLen) {
      iVar4 = *partialMatchLen;
    }
    *partialMatchLen = iVar4;
    if (iVar5 != -1) {
      *maxMatchLen = (int)uVar1;
      *maxMatchIndex = iVar5;
    }
    uVar8 = uVar1;
    if (iVar11 - iVar7 < 10) {
      iVar7 = *partialMatchLen;
      for (; lVar10 <= iVar11; lVar10 = lVar10 + 1) {
        iVar5 = currencyNames[lVar10].currencyNameLen;
        if (((textLen < iVar5) || (iVar5 <= *maxMatchLen)) ||
           (iVar4 = bcmp(currencyNames[lVar10].currencyName,text,(long)iVar5 * 2), iVar4 != 0)) {
          if (textLen <= iVar5) {
            iVar5 = textLen;
          }
          iVar4 = iVar7;
          for (lVar6 = (long)iVar7;
              (iVar4 = iVar4 + 1, lVar6 < iVar5 &&
              (currencyNames[lVar10].currencyName[lVar6] == text[lVar6])); lVar6 = lVar6 + 1) {
            iVar3 = iVar4;
            if (lVar6 < *partialMatchLen) {
              iVar3 = *partialMatchLen;
            }
            *partialMatchLen = iVar3;
          }
        }
        else {
          iVar4 = *partialMatchLen;
          if (*partialMatchLen <= iVar5) {
            iVar4 = iVar5;
          }
          *partialMatchLen = iVar4;
          *maxMatchIndex = (int32_t)lVar10;
          *maxMatchLen = iVar5;
        }
      }
      return;
    }
  }
  return;
}

Assistant:

static void
searchCurrencyName(const CurrencyNameStruct* currencyNames, 
                   int32_t total_currency_count,
                   const UChar* text, int32_t textLen,
                   int32_t *partialMatchLen,
                   int32_t* maxMatchLen, int32_t* maxMatchIndex) {
    *maxMatchIndex = -1;
    *maxMatchLen = 0;
    int32_t matchIndex = -1;
    int32_t binarySearchBegin = 0;
    int32_t binarySearchEnd = total_currency_count - 1;
    // It is a variant of binary search.
    // For example, given the currency names in currencyNames array are:
    // A AB ABC AD AZ B BB BBEX BBEXYZ BS C D E....
    // and the input text is BBEXST
    // The first round binary search search "B" in the text against
    // the first char in currency names, and find the first char matching range
    // to be "B BB BBEX BBEXYZ BS" (and the maximum matching "B").
    // The 2nd round binary search search the second "B" in the text against
    // the 2nd char in currency names, and narrow the matching range to
    // "BB BBEX BBEXYZ" (and the maximum matching "BB").
    // The 3rd round returnes the range as "BBEX BBEXYZ" (without changing
    // maximum matching).
    // The 4th round returns the same range (the maximum matching is "BBEX").
    // The 5th round returns no matching range.
    for (int32_t index = 0; index < textLen; ++index) {
        // matchIndex saves the one with exact match till the current point.
        // [binarySearchBegin, binarySearchEnd] saves the matching range.
        matchIndex = binarySearch(currencyNames, index,
                                  text[index],
                                  &binarySearchBegin, &binarySearchEnd);
        if (binarySearchBegin == -1) { // did not find the range
            break;
        }
        *partialMatchLen = MAX(*partialMatchLen, index + 1);
        if (matchIndex != -1) { 
            // find an exact match for text from text[0] to text[index] 
            // in currencyNames array.
            *maxMatchLen = index + 1;
            *maxMatchIndex = matchIndex;
        }
        if (binarySearchEnd - binarySearchBegin < LINEAR_SEARCH_THRESHOLD) {
            // linear search if within threshold.
            linearSearch(currencyNames, binarySearchBegin, binarySearchEnd,
                         text, textLen,
                         partialMatchLen,
                         maxMatchLen, maxMatchIndex);
            break;
        }
    }
    return;
}